

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstring.cpp
# Opt level: O3

char * uprv_strndup_63(char *src,int32_t n)

{
  char *pcVar1;
  
  if (-1 < n) {
    pcVar1 = (char *)uprv_malloc_63((ulong)(n + 1));
    if (pcVar1 == (char *)0x0) {
      pcVar1 = (char *)0x0;
    }
    else {
      memcpy(pcVar1,src,(ulong)(uint)n);
      pcVar1[(uint)n] = '\0';
    }
    return pcVar1;
  }
  pcVar1 = uprv_strdup_63(src);
  return pcVar1;
}

Assistant:

U_CAPI char* U_EXPORT2
uprv_strndup(const char *src, int32_t n) {
    char *dup;

    if(n < 0) {
        dup = uprv_strdup(src);
    } else {
        dup = (char*)uprv_malloc(n+1);
        if (dup) { 
            uprv_memcpy(dup, src, n);
            dup[n] = 0;
        }
    }

    return dup;
}